

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  string *psVar10;
  ImmutableFieldLiteGenerator *pIVar11;
  OneofDescriptor *text;
  OneofGeneratorInfo *pOVar12;
  FieldDescriptor *this_00;
  Context *context;
  Printer *this_01;
  int __c;
  Context *in_RSI;
  long in_RDI;
  int i_6;
  int i_5;
  FieldDescriptor *field_1;
  int j_1;
  FieldDescriptor *field;
  int j;
  OneofDescriptor *oneof;
  int i_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageLiteGenerator messageGenerator;
  int i_1;
  int i;
  string builder_type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  Printer *in_stack_fffffffffffff4b8;
  EnumLiteGenerator *in_stack_fffffffffffff4c0;
  Printer *in_stack_fffffffffffff4c8;
  ImmutableMessageLiteGenerator *in_stack_fffffffffffff4d0;
  SubstituteArg *in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4f0;
  undefined4 in_stack_fffffffffffff4f4;
  Printer *in_stack_fffffffffffff4f8;
  undefined4 in_stack_fffffffffffff500;
  undefined4 in_stack_fffffffffffff504;
  Printer *in_stack_fffffffffffff508;
  Context *in_stack_fffffffffffff510;
  Context *args_2;
  undefined4 in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff51c;
  JavaType type;
  Printer *in_stack_fffffffffffff520;
  FieldDescriptor *in_stack_fffffffffffff528;
  Context *text_00;
  Context *in_stack_fffffffffffff530;
  Context *pCVar13;
  Context *in_stack_fffffffffffff538;
  Context *in_stack_fffffffffffff540;
  Printer *in_stack_fffffffffffff548;
  EnumLiteGenerator *in_stack_fffffffffffff550;
  undefined7 in_stack_fffffffffffff560;
  undefined1 in_stack_fffffffffffff567;
  SubstituteArg *in_stack_fffffffffffff568;
  SubstituteArg *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff578;
  undefined1 in_stack_fffffffffffff57f;
  SubstituteArg *in_stack_fffffffffffff580;
  SubstituteArg *in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff61c;
  ImmutableMessageLiteGenerator *in_stack_fffffffffffff620;
  char *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6ac;
  Context *in_stack_fffffffffffff6b0;
  Printer *in_stack_fffffffffffff6c8;
  ImmutableMessageLiteGenerator *in_stack_fffffffffffff6d0;
  int local_814;
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [80];
  string local_718 [32];
  string local_6f8 [32];
  int local_6d8;
  allocator local_6d1;
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [56];
  Printer *in_stack_fffffffffffff9a8;
  EnumLiteGenerator *in_stack_fffffffffffff9b0;
  string local_640 [32];
  FieldDescriptor *local_620;
  int local_618;
  allocator local_611;
  string local_610 [32];
  string local_5f0 [80];
  string local_5a0 [32];
  string local_580 [32];
  FieldDescriptor *local_560;
  int local_558;
  allocator local_551;
  string local_550 [80];
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [32];
  OneofDescriptor *local_490;
  int local_484;
  string local_450 [32];
  int local_430;
  int local_42c;
  int local_428;
  int local_424;
  int local_3dc;
  int local_384;
  SubstituteArg local_380;
  SubstituteArg local_350;
  undefined1 local_320 [48];
  undefined1 local_2f0 [48];
  undefined1 local_2c0 [48];
  undefined1 local_290 [96];
  SubstituteArg local_230;
  SubstituteArg local_200;
  string local_1d0 [80];
  string local_180 [32];
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [80];
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar2 = IsOwnFile<google::protobuf::Descriptor>
                    ((Descriptor *)in_stack_fffffffffffff4c0,
                     SUB81((ulong)in_stack_fffffffffffff4b8 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x547fc9);
  pcVar8 = " static ";
  if ((bVar2 & 1) != 0) {
    pcVar8 = " ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"static",&local_69);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                        (key_type *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::operator=((string *)pmVar9,pcVar8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  psVar10 = Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"classname",&local_a1);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                        (key_type *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)psVar10);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ExtraMessageInterfaces_abi_cxx11_((Descriptor *)in_stack_fffffffffffff508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"extra_interfaces",&local_e9);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                        (key_type *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::operator=((string *)pmVar9,local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c8);
  Descriptor::options(*(Descriptor **)(in_RDI + 8));
  bVar3 = MessageOptions::deprecated((MessageOptions *)0x5481e7);
  pcVar8 = "";
  if (bVar3) {
    pcVar8 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"deprecation",&local_111);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                        (key_type *)in_stack_fffffffffffff4f8);
  std::__cxx11::string::operator=((string *)pmVar9,pcVar8);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  WriteMessageDocComment
            ((Printer *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
             (Descriptor *)in_stack_fffffffffffff4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"",&local_139);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (in_stack_fffffffffffff510,in_stack_fffffffffffff508,
             (Descriptor *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
             SUB81((ulong)in_stack_fffffffffffff4f8 >> 0x38,0),
             (string *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::string(local_160);
  iVar5 = Descriptor::extension_range_count(*(Descriptor **)(in_RDI + 8));
  if (iVar5 < 1) {
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                       in_stack_fffffffffffff6a0);
    std::__cxx11::string::operator=(local_160,"com.google.protobuf.GeneratedMessageLite.Builder");
  }
  else {
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                       in_stack_fffffffffffff6a0);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((ClassNameResolver *)in_stack_fffffffffffff4c8,
               (Descriptor *)in_stack_fffffffffffff4c0);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffff4c0,(string *)in_stack_fffffffffffff4b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_200);
    strings::internal::SubstituteArg::SubstituteArg(&local_230);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_290 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_290);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2c0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2f0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_320);
    strings::internal::SubstituteArg::SubstituteArg(&local_350);
    strings::internal::SubstituteArg::SubstituteArg(&local_380);
    in_stack_fffffffffffff4d8 = &local_350;
    in_stack_fffffffffffff4d0 = (ImmutableMessageLiteGenerator *)local_320;
    in_stack_fffffffffffff4c8 = (Printer *)local_2f0;
    in_stack_fffffffffffff4c0 = (EnumLiteGenerator *)local_2c0;
    in_stack_fffffffffffff4b8 = (Printer *)local_290;
    strings::Substitute_abi_cxx11_
              ((char *)in_stack_fffffffffffff528,(SubstituteArg *)in_stack_fffffffffffff520,
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               (SubstituteArg *)in_stack_fffffffffffff510,(SubstituteArg *)in_stack_fffffffffffff508
               ,(SubstituteArg *)CONCAT17(in_stack_fffffffffffff567,in_stack_fffffffffffff560),
               in_stack_fffffffffffff568,in_stack_fffffffffffff570,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
               in_stack_fffffffffffff580,in_stack_fffffffffffff588);
    std::__cxx11::string::operator=(local_160,local_180);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1d0);
  }
  io::Printer::Indent((Printer *)0x548736);
  GenerateConstructor(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  for (local_384 = 0; iVar5 = local_384,
      iVar6 = Descriptor::enum_type_count(*(Descriptor **)(in_RDI + 8)), iVar5 < iVar6;
      local_384 = local_384 + 1) {
    Descriptor::enum_type(*(Descriptor **)(in_RDI + 8),local_384);
    EnumLiteGenerator::EnumLiteGenerator
              (in_stack_fffffffffffff550,(EnumDescriptor *)in_stack_fffffffffffff548,
               SUB81((ulong)in_stack_fffffffffffff540 >> 0x38,0),in_stack_fffffffffffff538);
    EnumLiteGenerator::Generate(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    EnumLiteGenerator::~EnumLiteGenerator(in_stack_fffffffffffff4c0);
  }
  for (local_3dc = 0; iVar5 = local_3dc,
      iVar6 = Descriptor::nested_type_count(*(Descriptor **)(in_RDI + 8)), iVar5 < iVar6;
      local_3dc = local_3dc + 1) {
    Descriptor::nested_type(*(Descriptor **)(in_RDI + 8),local_3dc);
    bVar3 = IsMapEntry((Descriptor *)0x5488ba);
    if (!bVar3) {
      Descriptor::nested_type(*(Descriptor **)(in_RDI + 8),local_3dc);
      ImmutableMessageLiteGenerator
                ((ImmutableMessageLiteGenerator *)in_stack_fffffffffffff550,
                 (Descriptor *)in_stack_fffffffffffff548,in_stack_fffffffffffff540);
      GenerateInterface(in_stack_fffffffffffff620,
                        (Printer *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      Generate((ImmutableMessageLiteGenerator *)in_RSI,
               (Printer *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
      ~ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)in_stack_fffffffffffff4c0);
    }
  }
  local_424 = 0;
  for (local_428 = 0; iVar5 = local_428,
      iVar6 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)), iVar5 < iVar6;
      local_428 = local_428 + 1) {
    in_stack_fffffffffffff6c8 = (Printer *)(in_RDI + 0x20);
    in_stack_fffffffffffff6d0 =
         (ImmutableMessageLiteGenerator *)Descriptor::field(*(Descriptor **)(in_RDI + 8),local_428);
    pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                        ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                          *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    iVar5 = (*pIVar11->_vptr_ImmutableFieldLiteGenerator[2])();
    local_424 = iVar5 + local_424;
  }
  local_42c = (local_424 + 0x1f) / 0x20;
  for (local_430 = 0; local_430 < local_42c; local_430 = local_430 + 1) {
    pCVar13 = in_RSI;
    GetBitFieldName_abi_cxx11_((int)((ulong)in_stack_fffffffffffff528 >> 0x20));
    io::Printer::Print<char[15],std::__cxx11::string>
              (in_stack_fffffffffffff520,
               (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               (char (*) [15])in_stack_fffffffffffff510,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string(local_450);
    in_stack_fffffffffffff6b0 = in_RSI;
    in_RSI = pCVar13;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x548b50);
  local_484 = 0;
  while (iVar5 = local_484, iVar6 = Descriptor::oneof_decl_count(*(Descriptor **)(in_RDI + 8)),
        iVar5 < iVar6) {
    text = Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_484);
    local_490 = text;
    pOVar12 = Context::GetOneofGeneratorInfo
                        (in_stack_fffffffffffff530,(OneofDescriptor *)in_stack_fffffffffffff528);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b0,"oneof_name",&local_4b1);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                          (key_type *)in_stack_fffffffffffff4f8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)pOVar12);
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    pOVar12 = Context::GetOneofGeneratorInfo
                        (in_stack_fffffffffffff530,(OneofDescriptor *)in_stack_fffffffffffff528);
    psVar10 = &pOVar12->capitalized_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d8,"oneof_capitalized_name",&local_4d9);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                          (key_type *)in_stack_fffffffffffff4f8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)psVar10);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
    OneofDescriptor::index(local_490,(char *)psVar10,__c);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffff4c0,(int)((ulong)in_stack_fffffffffffff4b8 >> 0x20)
              );
    StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffff4f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"oneof_index",&local_551);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                          (key_type *)in_stack_fffffffffffff4f8);
    std::__cxx11::string::operator=((string *)pmVar9,local_500);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::__cxx11::string::~string(local_500);
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(iVar6,iVar5),(char *)text);
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(iVar6,iVar5),(char *)text);
    io::Printer::Indent((Printer *)0x548e5d);
    for (local_558 = 0; iVar1 = local_558, iVar7 = OneofDescriptor::field_count(local_490),
        iVar1 < iVar7; local_558 = local_558 + 1) {
      local_560 = OneofDescriptor::field(local_490,local_558);
      FieldDescriptor::name_abi_cxx11_(local_560);
      ToUpper((string *)in_stack_fffffffffffff4d8);
      FieldDescriptor::number(local_560);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffff4c0,
                 (int)((ulong)in_stack_fffffffffffff4b8 >> 0x20));
      StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffff4f8);
      io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528,
                 &in_stack_fffffffffffff520->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                 (char (*) [13])in_stack_fffffffffffff510,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff508);
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_580);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"oneof_name",&local_611);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                 (key_type *)in_stack_fffffffffffff4f8);
    ToUpper((string *)in_stack_fffffffffffff4d8);
    io::Printer::Print<char[15],std::__cxx11::string>
              (in_stack_fffffffffffff520,
               (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               (char (*) [15])in_stack_fffffffffffff510,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string(local_5f0);
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(iVar6,iVar5),(char *)text);
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(iVar6,iVar5),(char *)text);
    for (local_618 = 0; iVar1 = local_618, iVar7 = OneofDescriptor::field_count(local_490),
        iVar1 < iVar7; local_618 = local_618 + 1) {
      local_620 = OneofDescriptor::field(local_490,local_618);
      FieldDescriptor::number(local_620);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffff4c0,
                 (int)((ulong)in_stack_fffffffffffff4b8 >> 0x20));
      StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffff4f8);
      FieldDescriptor::name_abi_cxx11_(local_620);
      ToUpper((string *)in_stack_fffffffffffff4d8);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528,
                 &in_stack_fffffffffffff520->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                 (char (*) [11])in_stack_fffffffffffff510,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff508);
      std::__cxx11::string::~string(local_690);
      std::__cxx11::string::~string(local_640);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6d0,"oneof_name",&local_6d1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                 (key_type *)in_stack_fffffffffffff4f8);
    ToUpper((string *)in_stack_fffffffffffff4d8);
    io::Printer::Print<char[15],std::__cxx11::string>
              (in_stack_fffffffffffff520,
               (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               (char (*) [15])in_stack_fffffffffffff510,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string(local_6b0);
    std::__cxx11::string::~string(local_6d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    io::Printer::Outdent(in_stack_fffffffffffff520);
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_)
    ;
    io::Printer::Print((Printer *)in_stack_fffffffffffff6b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(iVar6,iVar5),(char *)text);
    local_484 = local_484 + 1;
  }
  for (local_6d8 = 0; iVar5 = local_6d8,
      iVar6 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)), iVar5 < iVar6;
      local_6d8 = local_6d8 + 1) {
    Descriptor::field(*(Descriptor **)(in_RDI + 8),local_6d8);
    FieldConstantName_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff4d8);
    this_00 = Descriptor::field(*(Descriptor **)(in_RDI + 8),local_6d8);
    FieldDescriptor::number(this_00);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)in_stack_fffffffffffff4c0,(int)((ulong)in_stack_fffffffffffff4b8 >> 0x20)
              );
    StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffff4f8);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffff530,(char *)in_stack_fffffffffffff528,
               &in_stack_fffffffffffff520->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               (char (*) [7])in_stack_fffffffffffff510,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string(local_718);
    std::__cxx11::string::~string(local_6f8);
    Descriptor::field(*(Descriptor **)(in_RDI + 8),local_6d8);
    pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                        ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                          *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    (*pIVar11->_vptr_ImmutableFieldLiteGenerator[4])(pIVar11,in_RSI);
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_)
    ;
  }
  GenerateParseFromMethods
            ((ImmutableMessageLiteGenerator *)
             CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),in_stack_fffffffffffff4f8
            );
  GenerateBuilder((ImmutableMessageLiteGenerator *)in_stack_fffffffffffff550,
                  in_stack_fffffffffffff548);
  bVar3 = HasRequiredFields((Descriptor *)
                            CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
  if (bVar3) {
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_)
    ;
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff4c8,(Descriptor *)in_stack_fffffffffffff4c0)
  ;
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_768);
  io::Printer::Indent((Printer *)0x54989d);
  io::Printer::Indent((Printer *)0x5498ac);
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_);
  io::Printer::Indent((Printer *)0x5498d1);
  GenerateDynamicMethodNewBuilder
            ((ImmutableMessageLiteGenerator *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  io::Printer::Outdent(in_stack_fffffffffffff520);
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_);
  io::Printer::Indent((Printer *)0x54991c);
  GenerateDynamicMethodNewBuildMessageInfo(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  io::Printer::Outdent(in_stack_fffffffffffff520);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff4c8,(Descriptor *)in_stack_fffffffffffff4c0)
  ;
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_788);
  io::Printer::Outdent(in_stack_fffffffffffff520);
  uVar4 = HasRequiredFields((Descriptor *)
                            CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
  if ((bool)uVar4) {
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_)
    ;
  }
  else {
    io::Printer::Print<>
              ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_)
    ;
  }
  io::Printer::Outdent(in_stack_fffffffffffff520);
  pCVar13 = in_RSI;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff4c8,(Descriptor *)in_stack_fffffffffffff4c0)
  ;
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_7a8);
  context = (Context *)Descriptor::full_name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff4c8,(Descriptor *)in_stack_fffffffffffff4c0)
  ;
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_7c8);
  text_00 = pCVar13;
  Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  args_2 = text_00;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff4c8,(Descriptor *)in_stack_fffffffffffff4c0)
  ;
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffff520,
             (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             (char (*) [10])in_stack_fffffffffffff510,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_7e8);
  this_01 = (Printer *)Descriptor::file(*(Descriptor **)(in_RDI + 8));
  bVar3 = IsWrappersProtoFile((FileDescriptor *)0x549c3f);
  type = CONCAT13(bVar3,(int3)in_stack_fffffffffffff51c);
  if (bVar3) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((ClassNameResolver *)in_stack_fffffffffffff4c8,
               (Descriptor *)in_stack_fffffffffffff4c0);
    in_stack_fffffffffffff508 = (Printer *)Descriptor::field(*(Descriptor **)(in_RDI + 8),0);
    GetJavaType((FieldDescriptor *)CONCAT44(type,in_stack_fffffffffffff518));
    PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              ((Printer *)pCVar13,(char *)text_00,&this_01->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(type,in_stack_fffffffffffff518),(char (*) [11])args_2,
               (char **)in_stack_fffffffffffff508);
    std::__cxx11::string::~string(local_808);
    in_stack_fffffffffffff510 = args_2;
  }
  GenerateParser((ImmutableMessageLiteGenerator *)in_stack_fffffffffffff4c0,
                 in_stack_fffffffffffff4b8);
  local_814 = 0;
  while (iVar5 = local_814, iVar6 = Descriptor::extension_count(*(Descriptor **)(in_RDI + 8)),
        iVar5 < iVar6) {
    Descriptor::extension(*(Descriptor **)(in_RDI + 8),local_814);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)CONCAT17(uVar4,in_stack_fffffffffffff560),
               (FieldDescriptor *)in_RSI,context);
    ImmutableExtensionLiteGenerator::Generate
              ((ImmutableExtensionLiteGenerator *)this_01,
               (Printer *)CONCAT44(type,in_stack_fffffffffffff518));
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)in_stack_fffffffffffff4c0);
    local_814 = local_814 + 1;
  }
  io::Printer::Outdent(this_01);
  io::Printer::Print<>
            ((Printer *)in_stack_fffffffffffff510,&in_stack_fffffffffffff508->variable_delimiter_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x549ec2);
  std::__cxx11::string::~string(local_160);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x549edc);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars, "public enum $oneof_capitalized_name$Case {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     ToUpper(field->name()), "field_number",
                     StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO(b/135620659): Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "private void clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "// fall through\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return null;\n"
        "}\n");
  }

  printer->Outdent();
  printer->Print(
      "  }\n"
      "  throw new UnsupportedOperationException();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}